

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O0

stack * stack_new(int startingSize)

{
  void **ppvVar1;
  stack *s;
  stack *psStack_10;
  int startingSize_local;
  
  psStack_10 = (stack *)malloc(0x18);
  if (psStack_10 != (stack *)0x0) {
    s._4_4_ = startingSize;
    if (startingSize < 1) {
      s._4_4_ = 0x40;
    }
    ppvVar1 = (void **)malloc((long)s._4_4_ << 3);
    psStack_10->element = ppvVar1;
    if (psStack_10->element == (void **)0x0) {
      free(psStack_10);
      psStack_10 = (stack *)0x0;
    }
    else {
      psStack_10->size = 0;
      psStack_10->capacity = (long)s._4_4_;
    }
  }
  return psStack_10;
}

Assistant:

stack * stack_new(int startingSize) {
	stack * s = malloc(sizeof(stack));

	if (s) {
		if (startingSize <= 0) {
			startingSize = kStackStartingSize;
		}

		s->element = malloc(sizeof(void *) * startingSize);

		if (!s->element) {
			free(s);
			return NULL;
		}

		s->size = 0;
		s->capacity = startingSize;
	}

	return s;
}